

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

FeatureMask
spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::get_feature_dependency_mask(Feature feature)

{
  long lVar1;
  FeatureMask FVar2;
  FeatureVector local_40;
  
  get_feature_dependencies(&local_40,feature);
  if (local_40.super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>.
      buffer_size == 0) {
    FVar2 = 0;
  }
  else {
    lVar1 = 0;
    FVar2 = 0;
    do {
      FVar2 = FVar2 | 1 << (*(byte *)((long)local_40.
                                            super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>
                                            .ptr + lVar1) & 0x1f);
      lVar1 = lVar1 + 4;
    } while (local_40.
             super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>.
             buffer_size << 2 != lVar1);
  }
  local_40.super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>.
  buffer_size = 0;
  if ((AlignedBuffer<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature,_8UL> *)
      local_40.super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>.ptr
      != &local_40.stack_storage) {
    free(local_40.super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>.
         ptr);
  }
  return FVar2;
}

Assistant:

CompilerGLSL::ShaderSubgroupSupportHelper::FeatureMask
CompilerGLSL::ShaderSubgroupSupportHelper::get_feature_dependency_mask(Feature feature)
{
	return build_mask(get_feature_dependencies(feature));
}